

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIImage::draw(CGUIImage *this)

{
  ITexture *pIVar1;
  dimension2d<unsigned_int> dVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  rect<int> clippingRect_2;
  rect<int> clippingRect_1;
  rect<int> clippingRect;
  rect<int> local_58;
  rect<int> local_48;
  rect<int> local_38;
  
  if (this->field_0xa0 != '\x01') {
    return;
  }
  plVar3 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
  pIVar1 = this->Texture;
  if (pIVar1 == (ITexture *)0x0) {
    if (this->DrawBackground == true) {
      local_58.UpperLeftCorner.X = *(int *)&this->field_0x50;
      local_58.UpperLeftCorner.Y = *(int *)&this->field_0x54;
      local_58.LowerRightCorner.X = *(uint *)&this->field_0x58;
      local_58.LowerRightCorner.Y = *(uint *)&this->field_0x5c;
      checkBounds(this,&local_58);
      local_48.UpperLeftCorner.X = (**(code **)*plVar3)(plVar3,0);
      (**(code **)(*plVar3 + 0xa8))(plVar3,this,&local_48,&this->field_0x40,&local_58);
    }
    goto LAB_00232094;
  }
  local_58.UpperLeftCorner = (this->SourceRect).UpperLeftCorner;
  dVar2.Width = (this->SourceRect).LowerRightCorner.X;
  dVar2.Height = (this->SourceRect).LowerRightCorner.Y;
  if (dVar2.Width == local_58.UpperLeftCorner.X) {
LAB_00231f51:
    dVar2.Width = (pIVar1->OriginalSize).Width;
    dVar2.Height = (pIVar1->OriginalSize).Height;
    local_58.LowerRightCorner = *(vector2d<int> *)&pIVar1->OriginalSize;
    local_58.UpperLeftCorner.X = 0;
    local_58.UpperLeftCorner.Y = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = local_58.UpperLeftCorner.X;
    uVar6 = local_58.UpperLeftCorner.Y;
    local_58.LowerRightCorner = (vector2d<int>)dVar2;
    if (dVar2.Height == local_58.UpperLeftCorner.Y) goto LAB_00231f51;
  }
  if (this->ScaleImage == true) {
    local_48.LowerRightCorner.X = (this->Color).color;
    local_48.UpperLeftCorner.Y = local_48.LowerRightCorner.X;
    local_48.UpperLeftCorner.X = local_48.LowerRightCorner.X;
    local_38.UpperLeftCorner.X = *(int *)&this->field_0x50;
    local_38.UpperLeftCorner.Y = *(int *)&this->field_0x54;
    local_38.LowerRightCorner.X = *(int *)&this->field_0x58;
    local_38.LowerRightCorner.Y = *(int *)&this->field_0x5c;
    local_48.LowerRightCorner.Y = local_48.LowerRightCorner.X;
    checkBounds(this,&local_38);
    (**(code **)(*plVar4 + 400))
              (plVar4,this->Texture,&this->field_0x40,&local_58,&local_38,&local_48,
               this->UseAlphaChannel);
  }
  else {
    local_48.UpperLeftCorner.X = *(int *)&this->field_0x40;
    local_48.UpperLeftCorner.Y = *(int *)&this->field_0x44;
    local_48.LowerRightCorner.X = (dVar2.Width - uVar5) + local_48.UpperLeftCorner.X;
    local_48.LowerRightCorner.Y = local_48.UpperLeftCorner.Y + (dVar2.Height - uVar6);
    checkBounds(this,&local_48);
    core::rect<int>::clipAgainst(&local_48,(rect<int> *)&this->field_0x50);
    (**(code **)(*plVar4 + 0x180))
              (plVar4,this->Texture,&this->field_0x40,&local_58,&local_48,(this->Color).color,
               this->UseAlphaChannel);
  }
LAB_00232094:
  IGUIElement::draw((IGUIElement *)this);
  return;
}

Assistant:

void CGUIImage::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	if (Texture) {
		core::rect<s32> sourceRect(SourceRect);
		if (sourceRect.getWidth() == 0 || sourceRect.getHeight() == 0) {
			sourceRect = core::rect<s32>(core::dimension2di(Texture->getOriginalSize()));
		}

		if (ScaleImage) {
			const video::SColor Colors[] = {Color, Color, Color, Color};

			core::rect<s32> clippingRect(AbsoluteClippingRect);
			checkBounds(clippingRect);

			driver->draw2DImage(Texture, AbsoluteRect, sourceRect,
					&clippingRect, Colors, UseAlphaChannel);
		} else {
			core::rect<s32> clippingRect(AbsoluteRect.UpperLeftCorner, sourceRect.getSize());
			checkBounds(clippingRect);
			clippingRect.clipAgainst(AbsoluteClippingRect);

			driver->draw2DImage(Texture, AbsoluteRect.UpperLeftCorner, sourceRect,
					&clippingRect, Color, UseAlphaChannel);
		}
	} else if (DrawBackground) {
		core::rect<s32> clippingRect(AbsoluteClippingRect);
		checkBounds(clippingRect);

		skin->draw2DRectangle(this, skin->getColor(EGDC_3D_DARK_SHADOW), AbsoluteRect, &clippingRect);
	}

	IGUIElement::draw();
}